

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

const_iterator __thiscall PcodeOpBank::begin(PcodeOpBank *this,OpCode opc)

{
  OpCode opc_local;
  PcodeOpBank *this_local;
  
  if (opc == CPUI_STORE) {
    this_local = (PcodeOpBank *)
                 std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&this->storelist);
  }
  else if (opc == CPUI_CALLOTHER) {
    this_local = (PcodeOpBank *)
                 std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&this->useroplist)
    ;
  }
  else if (opc == CPUI_RETURN) {
    this_local = (PcodeOpBank *)
                 std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&this->returnlist)
    ;
  }
  else {
    this_local = (PcodeOpBank *)
                 std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::end(&this->alivelist);
  }
  return (const_iterator)(_List_node_base *)this_local;
}

Assistant:

list<PcodeOp *>::const_iterator PcodeOpBank::begin(OpCode opc) const

{
  switch(opc) {
  case CPUI_STORE:
    return storelist.begin();
  case CPUI_RETURN:
    return returnlist.begin();
  case CPUI_CALLOTHER:
    return useroplist.begin();
  default:
    break;
  }
  return alivelist.end();
}